

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

unique_ptr<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>_> __thiscall
groundupdbext::EmbeddedDatabase::Impl::query(Impl *this,BucketQuery *query)

{
  pointer pKVar1;
  long *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  HashedValue local_c0;
  unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  local_88;
  unique_ptr<groundupdbext::DefaultQueryResult,_std::default_delete<groundupdbext::DefaultQueryResult>_>
  local_80;
  unique_ptr<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>_> local_78;
  unique_ptr<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>_> r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string idxKey;
  BucketQuery *query_local;
  Impl *this_local;
  
  (**(code **)(*in_RDX + 0x10))();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "bucket::",&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pKVar1 = std::
           unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
           operator->((unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                       *)(query + 5));
  std::__cxx11::string::string((string *)&local_e0,(string *)local_40);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>(&local_c0,&local_e0);
  (*(pKVar1->super_Store)._vptr_Store[5])(&local_88,pKVar1,&local_c0);
  std::
  make_unique<groundupdbext::DefaultQueryResult,std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>,std::default_delete<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>>>>
            ((unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
              *)&local_80);
  std::unique_ptr<groundupdb::IQueryResult,std::default_delete<groundupdb::IQueryResult>>::
  unique_ptr<groundupdbext::DefaultQueryResult,std::default_delete<groundupdbext::DefaultQueryResult>,void>
            ((unique_ptr<groundupdb::IQueryResult,std::default_delete<groundupdb::IQueryResult>> *)
             &local_78,&local_80);
  std::
  unique_ptr<groundupdbext::DefaultQueryResult,_std::default_delete<groundupdbext::DefaultQueryResult>_>
  ::~unique_ptr(&local_80);
  std::
  unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  ::~unique_ptr(&local_88);
  groundupdb::HashedValue::~HashedValue(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::unique_ptr<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>_>::
  unique_ptr((unique_ptr<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>_> *
             )this,&local_78);
  std::unique_ptr<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>_>::
  ~unique_ptr(&local_78);
  std::__cxx11::string::~string((string *)local_40);
  return (__uniq_ptr_data<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>,_true,_true>
          )(__uniq_ptr_data<groundupdb::IQueryResult,_std::default_delete<groundupdb::IQueryResult>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IQueryResult>
EmbeddedDatabase::Impl::query(BucketQuery& query) const {
  // Bucket query
  // construct a name for our key index
  std::string idxKey("bucket::" + query.bucket());
  // query the key index

  //std::cout << "EDB::Impl:query fetching kv set for bucket with key: " << idxKey << std::endl;
  std::unique_ptr<IQueryResult> r = std::make_unique<DefaultQueryResult>(m_indexStore->getKeyValueSet(HashedKey(idxKey)));
  //std::cout << "EDB::Impl:query result size: " << r.get()->recordKeys()->size() << std::endl;
  return std::move(r);
}